

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_8f9;
  string local_8f8;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> local_8d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"TPZGeoElRefLess",&local_8f9);
  uVar1 = Hash(&local_8f8);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TPZGeoBlend(&local_8d8);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::ClassId(&local_8d8);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::~TPZGeoBlend(&local_8d8);
  std::__cxx11::string::~string((string *)&local_8f8);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}